

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  TriggerPrg **ppTVar1;
  u8 uVar2;
  sqlite3 *db;
  TriggerStep *pStep;
  Op *pOVar3;
  int iVar4;
  Parse *pPVar5;
  TriggerPrg *pTVar6;
  SubProgram *pSVar7;
  Vdbe *pVVar8;
  char *pcVar9;
  Expr *pEVar10;
  SrcList *pSVar11;
  ExprList *pChanges;
  Expr *pWhere;
  Upsert *pUpsert;
  Select *pSVar12;
  Expr *in_R8;
  TriggerStep **ppTVar13;
  TriggerPrg **ppTVar14;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  Upsert *in_stack_fffffffffffffd70;
  int local_288;
  undefined1 local_240 [24];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  undefined8 uStack_200;
  int local_1f8;
  undefined4 uStack_1f4;
  char *pcStack_1f0;
  ExprList *local_1e8;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  ppTVar1 = &pPVar5->pTriggerPrg;
  ppTVar14 = ppTVar1;
  while (pTVar6 = *ppTVar14, pTVar6 != (TriggerPrg *)0x0) {
    if ((pTVar6->pTrigger == pTrigger) && (pTVar6->orconf == orconf)) goto LAB_001948b3;
    ppTVar14 = &pTVar6->pNext;
  }
  db = pParse->db;
  memset(&local_1e0,0xaa,0x1a8);
  pTVar6 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
  if (pTVar6 != (TriggerPrg *)0x0) {
    pTVar6->pNext = *ppTVar1;
    *ppTVar1 = pTVar6;
    pSVar7 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
    pTVar6->pProgram = pSVar7;
    if (pSVar7 != (SubProgram *)0x0) {
      pVVar8 = pPVar5->pVdbe;
      pWhere = (Expr *)pVVar8->pProgram;
      pSVar7->pNext = (SubProgram *)pWhere;
      pVVar8->pProgram = pSVar7;
      pTVar6->pTrigger = pTrigger;
      pTVar6->orconf = orconf;
      pTVar6->aColmask[0] = 0xffffffff;
      pTVar6->aColmask[1] = 0xffffffff;
      sqlite3ParseObjectInit(&local_1e0,db);
      local_218 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      local_240._8_16_ = (undefined1  [16])0x0;
      local_1e0.zAuthContext = pTrigger->zName;
      local_1e0.eTriggerOp = pTrigger->op;
      local_1e0.nQueryLoop = pParse->nQueryLoop;
      local_1e0.prepFlags = pParse->prepFlags;
      local_240._0_8_ = &local_1e0;
      local_1e0.pToplevel = pPVar5;
      local_1e0.pTriggerTab = pTab;
      pVVar8 = sqlite3GetVdbe(&local_1e0);
      if (pVVar8 == (Vdbe *)0x0) {
        transferParseError(pParse,&local_1e0);
      }
      else {
        if (pTrigger->zName != (char *)0x0) {
          pcVar9 = sqlite3MPrintf(db,"-- TRIGGER %s");
          pWhere = (Expr *)0xfffffffffffffffa;
          sqlite3VdbeChangeP4(pVVar8,-1,pcVar9,-6);
        }
        if (pTrigger->pWhen == (Expr *)0x0) {
          local_288 = 0;
        }
        else {
          local_288 = 0;
          pEVar10 = sqlite3ExprDup(db,pTrigger->pWhen,0);
          if (db->mallocFailed == '\0') {
            iVar4 = sqlite3ResolveExprNames((NameContext *)local_240,pEVar10);
            if (iVar4 == 0) {
              local_288 = local_1e0.nLabel + -1;
              pWhere = (Expr *)0x10;
              local_1e0.nLabel = local_288;
              sqlite3ExprIfFalse(&local_1e0,pEVar10,local_288,0x10);
            }
          }
          sqlite3ExprDelete(db,pEVar10);
        }
        ppTVar13 = &pTrigger->step_list;
        while (pStep = *ppTVar13, pStep != (TriggerStep *)0x0) {
          local_1e0.eOrconf = (u8)orconf;
          if (orconf == 0xb) {
            local_1e0.eOrconf = pStep->orconf;
          }
          if (pStep->zSpan != (char *)0x0) {
            pcVar9 = sqlite3MPrintf(local_1e0.db,"-- %s");
            in_stack_fffffffffffffd68 = 0xfffffffa;
            pWhere = (Expr *)0x1;
            in_R8 = (Expr *)0x0;
            sqlite3VdbeAddOp4(local_1e0.pVdbe,0xb8,0x7fffffff,1,0,pcVar9,-6);
          }
          uVar2 = pStep->op;
          if (uVar2 == 0x80) {
            pSVar11 = sqlite3TriggerStepSrc(&local_1e0,pStep);
            pSVar12 = sqlite3SelectDup(local_1e0.db,pStep->pSelect,0);
            pWhere = (Expr *)sqlite3IdListDup(local_1e0.db,pStep->pIdList);
            uVar2 = local_1e0.eOrconf;
            pUpsert = sqlite3UpsertDup(local_1e0.db,pStep->pUpsert);
            in_R8 = (Expr *)(ulong)(uint)uVar2;
            sqlite3Insert(&local_1e0,pSVar11,pSVar12,(IdList *)pWhere,(uint)uVar2,pUpsert);
LAB_00194759:
            sqlite3VdbeAddOp0(local_1e0.pVdbe,0x83);
          }
          else {
            if (uVar2 == 0x81) {
              pSVar11 = sqlite3TriggerStepSrc(&local_1e0,pStep);
              pEVar10 = sqlite3ExprDup(local_1e0.db,pStep->pWhere,0);
              sqlite3DeleteFrom(&local_1e0,pSVar11,pEVar10,(ExprList *)pWhere,in_R8);
              goto LAB_00194759;
            }
            if (uVar2 == 0x82) {
              pSVar11 = sqlite3TriggerStepSrc(&local_1e0,pStep);
              pChanges = sqlite3ExprListDup(local_1e0.db,pStep->pExprList,0);
              pWhere = sqlite3ExprDup(local_1e0.db,pStep->pWhere,0);
              in_R8 = (Expr *)(ulong)local_1e0.eOrconf;
              sqlite3Update(&local_1e0,pSVar11,pChanges,pWhere,(uint)local_1e0.eOrconf,
                            (ExprList *)0x0,
                            (Expr *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                            in_stack_fffffffffffffd70);
              goto LAB_00194759;
            }
            local_1e8 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
            local_1f8 = -0x55555556;
            uStack_1f4 = 0xaaaaaaaa;
            pcStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
            local_208._0_4_ = 0xaaaaaaaa;
            local_208._4_4_ = -0x55555556;
            uStack_200 = &DAT_aaaaaaaaaaaaaaaa;
            pSVar12 = sqlite3SelectDup(local_1e0.db,pStep->pSelect,0);
            local_208[0] = '\x04';
            pcStack_1f0 = (char *)0x0;
            local_208._4_4_ = 0;
            uStack_200._0_4_ = 0;
            uStack_200._4_4_ = 0;
            local_1f8 = 0;
            sqlite3Select(&local_1e0,pSVar12,(SelectDest *)local_208);
            sqlite3SelectDelete(local_1e0.db,pSVar12);
          }
          ppTVar13 = &pStep->pNext;
        }
        if (local_288 != 0) {
          sqlite3VdbeResolveLabel(pVVar8,local_288);
        }
        sqlite3VdbeAddOp0(pVVar8,0x46);
        transferParseError(pParse,&local_1e0);
        if (pParse->nErr == 0) {
          pOVar3 = pVVar8->aOp;
          resolveP2Values(pVVar8,&pPVar5->nMaxArg);
          pSVar7->nOp = pVVar8->nOp;
          pVVar8->aOp = (Op *)0x0;
          pSVar7->aOp = pOVar3;
        }
        pSVar7->nMem = local_1e0.nMem;
        pSVar7->nCsr = local_1e0.nTab;
        pSVar7->token = pTrigger;
        pTVar6->aColmask[0] = local_1e0.oldmask;
        pTVar6->aColmask[1] = local_1e0.newmask;
        sqlite3VdbeDelete(pVVar8);
      }
      sqlite3ParseObjectReset(&local_1e0);
      goto LAB_001948ac;
    }
  }
  pTVar6 = (TriggerPrg *)0x0;
LAB_001948ac:
  pParse->db->errByteOffset = -1;
LAB_001948b3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pTVar6;
  }
  __stack_chk_fail();
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}